

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O2

void __thiscall
Ptex::v2_2::PtexReader::readLargeMetaDataHeaders
          (PtexReader *this,MetaData *metadata,FilePos pos,int zipsize,int memsize,
          size_t *metaDataMemUsed)

{
  byte bVar1;
  byte datatype;
  uint32_t datasize;
  uint uVar2;
  int zipsize_00;
  bool bVar3;
  byte *pbVar4;
  byte *pbVar5;
  size_t **ppsVar6;
  long filepos;
  size_t *local_48;
  byte *local_40;
  int local_38;
  int local_34;
  
  local_48 = metaDataMemUsed;
  local_34 = zipsize;
  seek(this,pos);
  if (memsize < 0x4001) {
    pbVar4 = (byte *)((long)&local_48 - ((long)memsize + 0xfU & 0xfffffffffffffff0));
    ppsVar6 = (size_t **)pbVar4;
  }
  else {
    pbVar4 = (byte *)operator_new__((ulong)(uint)memsize);
    ppsVar6 = &local_48;
  }
  zipsize_00 = local_34;
  local_40 = pbVar4;
  local_38 = memsize;
  *(byte *)((long)ppsVar6 + -8) = 0x6e;
  *(byte *)((long)ppsVar6 + -7) = 0x98;
  *(byte *)((long)ppsVar6 + -6) = 0x41;
  *(byte *)((long)ppsVar6 + -5) = 0;
  *(byte *)((long)ppsVar6 + -4) = 0;
  *(byte *)((long)ppsVar6 + -3) = 0;
  *(byte *)((long)ppsVar6 + -2) = 0;
  *(byte *)((long)ppsVar6 + -1) = 0;
  bVar3 = readZipBlock(this,pbVar4,zipsize_00,memsize);
  if (bVar3) {
    filepos = zipsize_00 + pos;
    pbVar5 = local_40 + memsize;
    for (pbVar4 = local_40; pbVar4 < pbVar5; pbVar4 = pbVar4 + (ulong)bVar1 + 10) {
      bVar1 = *pbVar4;
      datatype = pbVar4[(ulong)bVar1 + 1];
      datasize = *(uint32_t *)(pbVar4 + (ulong)bVar1 + 2);
      uVar2 = *(uint *)(pbVar4 + (ulong)bVar1 + 6);
      *(size_t **)((long)ppsVar6 + -8) = local_48;
      *(ulong *)((long)ppsVar6 + -0x10) = (ulong)uVar2;
      *(byte *)((long)ppsVar6 + -0x18) = 0xba;
      *(byte *)((long)ppsVar6 + -0x17) = 0x98;
      *(byte *)((long)ppsVar6 + -0x16) = 0x41;
      *(byte *)((long)ppsVar6 + -0x15) = 0;
      *(byte *)((long)ppsVar6 + -0x14) = 0;
      *(byte *)((long)ppsVar6 + -0x13) = 0;
      *(byte *)((long)ppsVar6 + -0x12) = 0;
      *(byte *)((long)ppsVar6 + -0x11) = 0;
      MetaData::addLmdEntry
                (metadata,bVar1 - 1,(char *)(pbVar4 + 1),datatype,datasize,filepos,
                 *(uint32_t *)((long)ppsVar6 + -0x10),*(size_t **)((long)ppsVar6 + -8));
      filepos = filepos + (ulong)uVar2;
    }
  }
  pbVar4 = local_40;
  if (0x4000 < local_38) {
    *(byte *)((long)ppsVar6 + -8) = 0xd3;
    *(byte *)((long)ppsVar6 + -7) = 0x98;
    *(byte *)((long)ppsVar6 + -6) = 0x41;
    *(byte *)((long)ppsVar6 + -5) = 0;
    *(byte *)((long)ppsVar6 + -4) = 0;
    *(byte *)((long)ppsVar6 + -3) = 0;
    *(byte *)((long)ppsVar6 + -2) = 0;
    *(byte *)((long)ppsVar6 + -1) = 0;
    operator_delete__(pbVar4);
  }
  return;
}

Assistant:

void PtexReader::readLargeMetaDataHeaders(MetaData* metadata, FilePos pos, int zipsize, int memsize, size_t& metaDataMemUsed)
{
    seek(pos);
    // read from file
    bool useNew = memsize > AllocaMax;
    char* buff = useNew ? new char [memsize] : (char*)alloca(memsize);

    if (readZipBlock(buff, zipsize, memsize)) {
        pos += zipsize;

        // unpack data entries
        char* ptr = buff;
        char* end = ptr + memsize;
        while (ptr < end) {
            uint8_t keysize = *ptr++;
            char* key = (char*)ptr; ptr += keysize;
            uint8_t datatypeval = *ptr++;
            uint32_t datasize; memcpy(&datasize, ptr, sizeof(datasize));
            ptr += sizeof(datasize);
            uint32_t zipsizeval; memcpy(&zipsizeval, ptr, sizeof(zipsizeval));
            ptr += sizeof(zipsizeval);
            metadata->addLmdEntry((uint8_t)(keysize-1), key, datatypeval, datasize, pos, zipsizeval, metaDataMemUsed);
            pos += zipsizeval;
        }
    }
    if (useNew) delete [] buff;
}